

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_TAP_DEVICE(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  byte *pbVar2;
  short sVar3;
  player_upkeep *ppVar4;
  player *ppVar5;
  _Bool _Var6;
  wchar_t wVar7;
  uint uVar8;
  uint32_t uVar9;
  byte can_disturb;
  char *pcVar10;
  short sVar11;
  object *obj;
  object *local_28;
  
  if (context->cmd == (command *)0x0) {
    _Var6 = get_item(&local_28,"Drain charges from which item? ",
                     "You have nothing to drain charges from.",CMD_NULL,tval_can_have_charges,
                     L'\x06');
    if (!_Var6) {
      return false;
    }
  }
  else {
    wVar7 = cmd_get_item((command_conflict *)context->cmd,"tgtitem",&local_28,
                         "Drain charges from which item? ","You have nothing to drain charges from."
                         ,tval_can_have_charges,L'\x06');
    if (wVar7 != L'\0') {
      return false;
    }
  }
  wVar7 = local_28->kind->level;
  _Var6 = tval_is_staff(local_28);
  if (_Var6) {
    pcVar10 = "Use a staff";
  }
  else {
    _Var6 = tval_is_wand(local_28);
    if (!_Var6) {
      pcVar10 = "";
      uVar8 = 0;
      goto LAB_00142366;
    }
    pcVar10 = "Aim a wand";
  }
  pcVar10 = pcVar10 + 6;
  uVar8 = ((int)local_28->pval * (wVar7 * 3 + 0xf)) / 2;
LAB_00142366:
  ppVar5 = player;
  if ((int)uVar8 < 0x24) {
    _Var6 = false;
    msg("That %s had no useable energy");
  }
  else {
    sVar3 = player->msp;
    sVar11 = player->csp;
    if (sVar11 < sVar3) {
      local_28->pval = 0;
      ppVar4 = ppVar5->upkeep;
      puVar1 = &ppVar4->notice;
      *puVar1 = *puVar1 | 1;
      pbVar2 = (byte *)((long)&ppVar4->redraw + 2);
      *pbVar2 = *pbVar2 | 2;
      sVar11 = sVar11 + (short)(uVar8 / 6);
      ppVar5->csp = sVar11;
      ppVar5->csp_frac = 0;
      if (sVar3 < sVar11) {
        ppVar5->csp = sVar3;
      }
      msg("You feel your head clear.");
      ppVar5 = player;
      uVar9 = Rand_div(2);
      _Var6 = true;
      can_disturb = true;
      if ((context->origin).what == SRC_PLAYER) {
        can_disturb = context->aware ^ 1;
      }
      player_inc_timed(ppVar5,L'\t',uVar9 + L'\x01',true,(_Bool)can_disturb,true);
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x80;
    }
    else {
      pcVar10 = string_make(pcVar10);
      my_strcap(pcVar10);
      _Var6 = false;
      msg("Your mana was already at its maximum.  %s not drained.",pcVar10);
      string_free(pcVar10);
    }
  }
  return _Var6;
}

Assistant:

bool effect_handler_TAP_DEVICE(effect_handler_context_t *context)
{
	int lev;
	int energy = 0;
	struct object *obj;
	bool used = false;
	int itemmode = (USE_INVEN | USE_FLOOR);
	const char *q, *s;
	const char *item = "";

	/* Get an item */
	q = "Drain charges from which item? ";
	s = "You have nothing to drain charges from.";
	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, q, s,
				tval_can_have_charges, itemmode)) {
			return used;
		}
	} else if (!get_item(&obj, q, s, 0, tval_can_have_charges, itemmode)) {
		return (used);
	}

	/* Extract the object "level" */
	lev = obj->kind->level;

	/* Extract the object's energy and get its generic name. */
	if (tval_is_staff(obj)) {
		energy = (5 + lev) * 3 * obj->pval / 2;
		item = "staff";
	} else if (tval_is_wand(obj)) {
		energy = (5 + lev) * 3 * obj->pval / 2;
		item = "wand";
	}

	/* Turn energy into mana. */
	if (energy < 36) {
		/* Require a resonable amount of energy */
		msg("That %s had no useable energy", item);
	} else {
		/* If mana below maximum, increase mana and drain object. */
		if (player->csp < player->msp) {
			/* Drain the object. */
			obj->pval = 0;


			/* Combine / Reorder the pack (later) */
			player->upkeep->notice |= (PN_COMBINE);

			/* Redraw stuff */
			player->upkeep->redraw |= (PR_INVEN);

			/* Increase mana. */
			player->csp += energy / 6;
			player->csp_frac = 0;
			if (player->csp > player->msp) {
				(player->csp = player->msp);
			}

			msg("You feel your head clear.");
			used = true;
			player_inc_timed(player, TMD_STUN, randint1(2), true,
				context->origin.what != SRC_PLAYER
				|| !context->aware, true);

			player->upkeep->redraw |= (PR_MANA);
		} else {
			char *cap = string_make(item);
			my_strcap(cap);
			msg("Your mana was already at its maximum.  %s not drained.", cap);
			string_free(cap);
		}
	}

	return (used);
}